

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.h
# Opt level: O2

void __thiscall MeCab::CharProperty::~CharProperty(CharProperty *this)

{
  ~CharProperty(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~CharProperty() { this->close(); }